

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

string * __thiscall
gvr::(anonymous_namespace)::PLYProperty::type2Name_abi_cxx11_
          (string *__return_storage_ptr__,PLYProperty *this,ply_type type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "int8";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "uint8";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "int16";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "uint16";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "int32";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "uint32";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "float32";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "float64";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "none";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PLYProperty::type2Name(ply_type type)
{
  switch (type)
  {
    case ply_int8:
      return "int8";

    case ply_uint8:
      return "uint8";

    case ply_int16:
      return "int16";

    case ply_uint16:
      return "uint16";

    case ply_int32:
      return "int32";

    case ply_uint32:
      return "uint32";

    case ply_float32:
      return "float32";

    case ply_float64:
      return "float64";

    default:
      break;
  }

  assert(false);

  return "none";
}